

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O2

Connection
QObjectPrivate::
connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QIdentityProxyModelPrivate::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>
          (Object *sender,offset_in_QAbstractItemModel_to_subr signal,Object *receiverPrivate,
          Function slot,ConnectionType type)

{
  QObject *receiver;
  int *types;
  QSlotObjectBase *slotObjRaw;
  undefined4 in_register_00000084;
  ConnectionType in_R9D;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  ImplFn in_stack_00000010;
  void *local_58 [2];
  Object *local_48;
  Function local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = receiverPrivate;
  local_40 = slot;
  if ((in_R9D & ~DirectConnection) == QueuedConnection) {
    types = QtPrivate::
            ConnectionTypes<QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_true>
            ::types();
  }
  else {
    types = (int *)0x0;
  }
  receiver = *(QObject **)(CONCAT44(in_register_00000084,type) + 8);
  slotObjRaw = (QSlotObjectBase *)operator_new(0x20);
  (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  slotObjRaw->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QIdentityProxyModelPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
       ::impl;
  *(undefined8 *)(slotObjRaw + 1) = in_stack_00000008;
  slotObjRaw[1].m_impl = in_stack_00000010;
  QObject::connectImpl
            (&sender->super_QObject,(QObject *)signal,&local_48,receiver,local_58,slotObjRaw,in_R9D,
             types,&QAbstractItemModel::staticMetaObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Connection)sender;
  }
  __stack_chk_fail();
}

Assistant:

inline QMetaObject::Connection QObjectPrivate::connect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                                                       const typename QtPrivate::FunctionPointer<Func2>::Object *receiverPrivate, Func2 slot,
                                                       Qt::ConnectionType type)
{
    typedef QtPrivate::FunctionPointer<Func1> SignalType;
    typedef QtPrivate::FunctionPointer<Func2> SlotType;
    static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                      "No Q_OBJECT in the class with the signal");

    //compilation error if the arguments does not match.
    static_assert(int(SignalType::ArgumentCount) >= int(SlotType::ArgumentCount),
                      "The slot requires more arguments than the signal provides.");
    static_assert((QtPrivate::CheckCompatibleArguments<typename SignalType::Arguments, typename SlotType::Arguments>::value),
                      "Signal and slot arguments are not compatible.");
    static_assert((QtPrivate::AreArgumentsCompatible<typename SlotType::ReturnType, typename SignalType::ReturnType>::value),
                      "Return type of the slot is not compatible with the return type of the signal.");

    const int *types = nullptr;
    if (type == Qt::QueuedConnection || type == Qt::BlockingQueuedConnection)
        types = QtPrivate::ConnectionTypes<typename SignalType::Arguments>::types();

    return QObject::connectImpl(sender, reinterpret_cast<void **>(&signal),
        QtPrivate::getQObject(receiverPrivate), reinterpret_cast<void **>(&slot),
        new QtPrivate::QPrivateSlotObject<Func2, typename QtPrivate::List_Left<typename SignalType::Arguments, SlotType::ArgumentCount>::Value,
                                        typename SignalType::ReturnType>(slot),
        type, types, &SignalType::Object::staticMetaObject);
}